

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O3

int pt_evt_recover_ovf_at_ip
              (pt_event_decoder *decoder,pt_packet_decoder *pacdec,pt_packet *packet,
              pt_packet_ip *ip,pt_time *time,pt_time_cal *tcal)

{
  pt_packet_mode pVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  uint8_t uVar8;
  undefined3 uVar9;
  uint32_t uVar10;
  undefined7 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  undefined4 in_EAX;
  int iVar14;
  uint uVar15;
  uint uVar16;
  pt_event *ppVar17;
  undefined1 auVar18 [16];
  
  auVar18._0_4_ = -(uint)(pacdec == (pt_packet_decoder *)0x0);
  auVar18._4_4_ = -(uint)(packet == (pt_packet *)0x0);
  auVar18._8_4_ = -(uint)(time == (pt_time *)0x0);
  auVar18._12_4_ = -(uint)(tcal == (pt_time_cal *)0x0);
  iVar14 = movmskps(in_EAX,auVar18);
  uVar15 = 0xffffffff;
  if (iVar14 == 0) {
    uVar15 = pt_last_ip_update_ip(&decoder->ip,ip,(pt_config *)decoder);
    if (-1 < (int)uVar15) {
      ppVar17 = pt_evq_standalone(&decoder->evq);
      decoder->event = ppVar17;
      uVar15 = 0xffffffff;
      if (ppVar17 != (pt_event *)0x0) {
        ppVar17->type = ptev_overflow;
        iVar14 = pt_time_query_tsc(&ppVar17->tsc,&ppVar17->lost_mtc,&ppVar17->lost_cyc,
                                   &decoder->time);
        if (iVar14 < 0) {
          if (iVar14 != -0xf) {
            return iVar14;
          }
        }
        else {
          ppVar17->field_0x4 = ppVar17->field_0x4 | 4;
        }
        memcpy(decoder,pacdec,0x128);
        (decoder->packet).payload.tnt.payload = (packet->payload).tnt.payload;
        uVar8 = packet->size;
        uVar9 = *(undefined3 *)&packet->field_0x5;
        pVar1 = (packet->payload).mode;
        (decoder->packet).type = packet->type;
        (decoder->packet).size = uVar8;
        *(undefined3 *)&(decoder->packet).field_0x5 = uVar9;
        (decoder->packet).payload.mode = pVar1;
        uVar2 = time->tsc;
        uVar3 = time->base;
        uVar4 = time->fc;
        uVar12 = time->ctc;
        uVar13 = time->ctc_cyc;
        uVar10 = time->lost_cyc;
        uVar8 = time->cbr;
        uVar11 = *(undefined7 *)&time->field_0x29;
        (decoder->time).lost_mtc = time->lost_mtc;
        (decoder->time).lost_cyc = uVar10;
        (decoder->time).cbr = uVar8;
        *(undefined7 *)&(decoder->time).field_0x29 = uVar11;
        (decoder->time).fc = uVar4;
        (decoder->time).ctc = uVar12;
        (decoder->time).ctc_cyc = uVar13;
        (decoder->time).tsc = uVar2;
        (decoder->time).base = uVar3;
        uVar2 = tcal->min_fcr;
        uVar3 = tcal->max_fcr;
        uVar4 = tcal->tsc;
        uVar5 = tcal->cyc_tsc;
        uVar6 = tcal->cyc_mtc;
        uVar10 = tcal->ctc;
        uVar12 = tcal->lost_mtc;
        uVar7 = *(undefined8 *)&tcal->field_0x38;
        (decoder->tcal).fcr = tcal->fcr;
        (decoder->tcal).min_fcr = uVar2;
        (decoder->tcal).max_fcr = uVar3;
        (decoder->tcal).tsc = uVar4;
        (decoder->tcal).cyc_tsc = uVar5;
        (decoder->tcal).cyc_mtc = uVar6;
        (decoder->tcal).ctc = uVar10;
        (decoder->tcal).lost_mtc = uVar12;
        *(undefined8 *)&(decoder->tcal).field_0x38 = uVar7;
        decoder->field_0x72c = decoder->field_0x72c | 0x10;
        uVar16 = pt_last_ip_query(&(ppVar17->variant).disabled.ip,&decoder->ip);
        uVar15 = 0;
        if (((int)uVar16 < 0) && (uVar15 = uVar16, (uVar16 & 0xfffffffe) == 0xfffffff4)) {
          ppVar17->field_0x4 = ppVar17->field_0x4 | 1;
          uVar15 = 0;
        }
      }
    }
  }
  return uVar15;
}

Assistant:

static int pt_evt_recover_ovf_at_ip(struct pt_event_decoder *decoder,
				    const struct pt_packet_decoder *pacdec,
				    const struct pt_packet *packet,
				    const struct pt_packet_ip *ip,
				    const struct pt_time *time,
				    const struct pt_time_cal *tcal)
{
	const struct pt_config *config;
	struct pt_event *ev;
	int errcode;

	if (!decoder || !pacdec || !packet || !time || !tcal)
		return -pte_internal;

	config = pt_evt_config(decoder);

	errcode = pt_last_ip_update_ip(&decoder->ip, ip, config);
	if (errcode < 0)
		return errcode;

	decoder->event = ev = pt_evq_standalone(&decoder->evq);
	if (!ev)
		return -pte_internal;

	ev->type = ptev_overflow;

	/* We use the decoder's original time for this event. */
	errcode = pt_evt_event_time(ev, &decoder->time);
	if (errcode < 0)
		return errcode;

	decoder->pacdec = *pacdec;
	decoder->packet = *packet;
	decoder->time = *time;
	decoder->tcal = *tcal;
	decoder->enabled = 1;

	return pt_evt_event_ip(&ev->variant.overflow.ip, ev, &decoder->ip);
}